

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_xform(MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
              TxfmParam *txfm_param)

{
  long *plVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  int16_t *src_diff;
  int src_offset;
  int diff_stride;
  tran_low_t *coeff;
  int block_offset;
  macroblock_plane *p;
  undefined4 in_stack_ffffffffffffffd0;
  
  plVar1 = (long *)(in_RDI + (long)in_ESI * 0x88);
  av1_fwd_txfm((int16_t *)CONCAT44(in_EDX << 4,in_stack_ffffffffffffffd0),
               (tran_low_t *)(plVar1[3] + (long)(in_EDX << 4) * 4),(uint)block_size_wide[in_R9B],
               (TxfmParam *)
               (*plVar1 + (long)(int)((in_ECX * (uint)block_size_wide[in_R9B] + in_R8D) * 4) * 2));
  return;
}

Assistant:

void av1_xform(MACROBLOCK *x, int plane, int block, int blk_row, int blk_col,
               BLOCK_SIZE plane_bsize, TxfmParam *txfm_param) {
  const struct macroblock_plane *const p = &x->plane[plane];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *const coeff = p->coeff + block_offset;
  const int diff_stride = block_size_wide[plane_bsize];

  const int src_offset = (blk_row * diff_stride + blk_col);
  const int16_t *src_diff = &p->src_diff[src_offset << MI_SIZE_LOG2];

  av1_fwd_txfm(src_diff, coeff, diff_stride, txfm_param);
}